

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O2

FloatRect __thiscall sf::Transform::transformRect(Transform *this,FloatRect *rectangle)

{
  Vector2f VVar1;
  long lVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar4;
  float fVar5;
  float fVar6;
  FloatRect FVar7;
  float afStack_48 [2];
  Vector2f local_40;
  Vector2f local_38;
  Vector2f local_30;
  undefined1 local_28 [24];
  
  fVar3 = rectangle->left;
  fVar5 = rectangle->top;
  VVar1 = transformPoint(this,fVar3,fVar5);
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._0_4_ = VVar1.x;
  local_28._4_4_ = VVar1.y;
  local_28._12_4_ = extraout_XMM0_Dd;
  fVar4 = rectangle->height + fVar5;
  local_40 = transformPoint(this,fVar3,fVar4);
  fVar3 = fVar3 + rectangle->width;
  local_38 = transformPoint(this,fVar3,fVar5);
  local_30 = transformPoint(this,fVar3,fVar4);
  fVar3 = (float)local_28._0_4_;
  fVar5 = (float)local_28._4_4_;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    fVar4 = afStack_48[lVar2 * 2];
    fVar6 = fVar4;
    if ((fVar4 < (float)local_28._0_4_) || (fVar6 = (float)local_28._0_4_, fVar4 <= fVar3)) {
      local_28._0_4_ = fVar6;
      fVar4 = fVar3;
    }
    fVar6 = afStack_48[lVar2 * 2 + 1];
    fVar3 = fVar6;
    if ((fVar6 < (float)local_28._4_4_) || (fVar3 = (float)local_28._4_4_, fVar6 <= fVar5)) {
      local_28._4_4_ = fVar3;
      fVar6 = fVar5;
    }
    fVar3 = fVar4;
    fVar5 = fVar6;
  }
  FVar7.width = fVar3 - (float)local_28._0_4_;
  FVar7.height = fVar5 - (float)local_28._4_4_;
  FVar7.top = (float)local_28._4_4_;
  FVar7.left = (float)local_28._0_4_;
  return FVar7;
}

Assistant:

FloatRect Transform::transformRect(const FloatRect& rectangle) const
{
    // Transform the 4 corners of the rectangle
    const Vector2f points[] =
    {
        transformPoint(rectangle.left, rectangle.top),
        transformPoint(rectangle.left, rectangle.top + rectangle.height),
        transformPoint(rectangle.left + rectangle.width, rectangle.top),
        transformPoint(rectangle.left + rectangle.width, rectangle.top + rectangle.height)
    };

    // Compute the bounding rectangle of the transformed points
    float left = points[0].x;
    float top = points[0].y;
    float right = points[0].x;
    float bottom = points[0].y;
    for (int i = 1; i < 4; ++i)
    {
        if      (points[i].x < left)   left = points[i].x;
        else if (points[i].x > right)  right = points[i].x;
        if      (points[i].y < top)    top = points[i].y;
        else if (points[i].y > bottom) bottom = points[i].y;
    }

    return FloatRect(left, top, right - left, bottom - top);
}